

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::zeEventQueryStatus(ze_event_handle_t hEvent)

{
  Logger *this;
  code *pcVar1;
  long *plVar2;
  long lVar3;
  ze_result_t result;
  ze_result_t zVar4;
  size_t i;
  long lVar5;
  long lVar6;
  size_t i_1;
  allocator local_51;
  string local_50;
  
  lVar3 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string((string *)&local_50,"zeEventQueryStatus(hEvent)",&local_51);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = *(code **)(lVar3 + 0x4c0);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd38) - *(long *)(lVar3 + 0xd30) >> 3;
    lVar5 = 0;
    do {
      if (lVar6 == lVar5) {
        if ((*(char *)(lVar3 + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeEventQueryStatusPrologue
                               (*(ZEHandleLifetimeValidation **)(lVar3 + 0xd48),hEvent),
           result == ZE_RESULT_SUCCESS)) {
          zVar4 = (*pcVar1)(hEvent);
          lVar5 = 0;
          goto LAB_0014e00d;
        }
        break;
      }
      plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
      result = (**(code **)(*plVar2 + 0x480))(plVar2,hEvent);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_0014e038;
  while( true ) {
    plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
    result = (**(code **)(*plVar2 + 0x488))(plVar2,hEvent,zVar4);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0014e00d:
    result = zVar4;
    if (lVar6 == lVar5) break;
  }
LAB_0014e038:
  logAndPropagateResult("zeEventQueryStatus",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventQueryStatus(
        ze_event_handle_t hEvent                        ///< [in] handle of the event
        )
    {
        context.logger->log_trace("zeEventQueryStatus(hEvent)");

        auto pfnQueryStatus = context.zeDdiTable.Event.pfnQueryStatus;

        if( nullptr == pfnQueryStatus )
            return logAndPropagateResult("zeEventQueryStatus", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventQueryStatusPrologue( hEvent );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventQueryStatus", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeEventQueryStatusPrologue( hEvent );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventQueryStatus", result);
        }

        auto driver_result = pfnQueryStatus( hEvent );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventQueryStatusEpilogue( hEvent ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventQueryStatus", result);
        }

        return logAndPropagateResult("zeEventQueryStatus", driver_result);
    }